

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_default_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  int iVar1;
  ma_result mVar2;
  wchar_t *pwVar3;
  stat info;
  stat sStack_98;
  
  mVar2 = MA_INVALID_ARGS;
  if (pInfo != (ma_file_info *)0x0) {
    pInfo->sizeInBytes = 0;
    if (file != (ma_vfs_file)0x0) {
      iVar1 = fileno((FILE *)file);
      iVar1 = fstat(iVar1,&sStack_98);
      if (iVar1 == 0) {
        pInfo->sizeInBytes = sStack_98.st_size;
        mVar2 = MA_SUCCESS;
      }
      else {
        pwVar3 = __errno_location();
        mVar2 = ma_result_from_errno(*pwVar3);
      }
    }
  }
  return mVar2;
}

Assistant:

static ma_result ma_default_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_WIN32) && defined(MA_WIN32_DESKTOP) && !defined(MA_NO_WIN32_FILEIO)
    return ma_default_vfs_info__win32(pVFS, file, pInfo);
#else
    return ma_default_vfs_info__stdio(pVFS, file, pInfo);
#endif
}